

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O2

bool __thiscall
ON_ObjRefEvaluationParameter::Read(ON_ObjRefEvaluationParameter *this,ON_BinaryArchive *archive)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ON_ObjRefEvaluationParameter *pOVar5;
  ON_ObjRefEvaluationParameter *pOVar6;
  byte bVar7;
  int minor_version;
  int major_version;
  
  bVar7 = 0;
  ON_ObjRefEvaluationParameter((ON_ObjRefEvaluationParameter *)&major_version);
  pOVar5 = (ON_ObjRefEvaluationParameter *)&major_version;
  pOVar6 = this;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    iVar1 = pOVar5->m_reserved;
    pOVar6->m_t_type = pOVar5->m_t_type;
    pOVar6->m_reserved = iVar1;
    pOVar5 = (ON_ObjRefEvaluationParameter *)((long)pOVar5 + (ulong)bVar7 * -0x10 + 8);
    pOVar6 = (ON_ObjRefEvaluationParameter *)((long)pOVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  ~ON_ObjRefEvaluationParameter((ON_ObjRefEvaluationParameter *)&major_version);
  major_version = 0;
  minor_version = 0;
  bVar2 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&major_version,&minor_version);
  if (bVar2) {
    if ((((major_version == 1) &&
         (bVar2 = ON_BinaryArchive::ReadInt(archive,&this->m_t_type), bVar2)) &&
        (bVar2 = ON_BinaryArchive::ReadComponentIndex(archive,&this->m_t_ci), bVar2)) &&
       (((bVar2 = ON_BinaryArchive::ReadDouble(archive,4,this->m_t), bVar2 &&
         (bVar2 = ON_BinaryArchive::ReadInterval(archive,(ON_Interval *)&this->field_0x28), bVar2))
        && (bVar2 = ON_BinaryArchive::ReadInterval(archive,(ON_Interval *)&this->field_0x38), bVar2)
        ))) {
      bVar2 = ON_BinaryArchive::ReadInterval(archive,(ON_Interval *)&this->field_0x48);
    }
    else {
      bVar2 = false;
    }
    bVar3 = ON_BinaryArchive::EndRead3dmChunk(archive);
    return (bool)(bVar3 & bVar2);
  }
  return false;
}

Assistant:

bool ON_ObjRefEvaluationParameter::Read( ON_BinaryArchive& archive )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return rc;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadInt(&m_t_type);
    if (!rc) break;

    rc = archive.ReadComponentIndex(m_t_ci);
    if (!rc) break;

    rc = archive.ReadDouble(4,m_t);
    if (!rc) break;

    rc = archive.ReadInterval(m_s[0]);
    if (!rc) break;

    rc = archive.ReadInterval(m_s[1]);
    if (!rc) break;

    rc = archive.ReadInterval(m_s[2]);
    if (!rc) break;

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;

  return rc;
}